

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture3DView *src,float *texCoord,ReferenceParams *params)

{
  Sampler *sampler;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  byte bVar14;
  bool bVar15;
  ulong uVar16;
  int i;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ConstPixelBufferAccess *levels;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  Texture3DView TVar44;
  Vector<float,_4> res_1;
  Vec3 triT [2];
  Vec3 triS [2];
  Vec3 triR [2];
  float triLod [2];
  IVec2 dstSize;
  Vector<float,_4> res;
  Vec3 triW [2];
  IVec3 srcSize;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vector<float,_4> res_6;
  Vec4 wq;
  Vec4 rq;
  Vec4 tq;
  Vec4 sq;
  Texture3DView view;
  Vector<float,_4> res_5;
  float local_210;
  int local_208 [2];
  undefined8 uStack_200;
  undefined4 local_1f8;
  int local_1f4;
  Vec3 local_1e8;
  Vec3 local_1dc;
  Vec3 local_1c8;
  Vec3 local_1bc;
  ConstPixelBufferAccess *local_1b0;
  Vec3 local_1a8;
  Vec3 local_19c;
  undefined8 local_188;
  undefined8 uStack_180;
  IVec2 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined4 local_154;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_118 [8];
  IVec3 local_f8;
  float local_ec;
  float local_e8;
  float local_e4;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_d8;
  float local_b8;
  uint uStack_b4;
  undefined8 uStack_b0;
  float local_a8 [8];
  float local_88 [4];
  float local_78 [4];
  Texture3DView local_68;
  float local_58 [6];
  tcu local_40 [16];
  
  TVar44 = getSubView(src,params->baseLevel,params->maxLevel);
  local_68.m_levels = TVar44.m_levels;
  local_68.m_numLevels = TVar44.m_numLevels;
  fVar36 = *texCoord;
  fVar28 = texCoord[3];
  fVar41 = texCoord[6];
  fVar38 = texCoord[9];
  fVar37 = texCoord[1];
  fVar1 = texCoord[4];
  fVar2 = texCoord[7];
  fVar3 = texCoord[10];
  fVar4 = texCoord[2];
  fVar5 = texCoord[5];
  fVar6 = texCoord[8];
  fVar7 = texCoord[0xb];
  sampler = &params->sampler;
  local_a8[4] = fVar4;
  local_a8[5] = fVar5;
  local_a8[6] = fVar6;
  local_a8[7] = fVar7;
  local_88[0] = fVar37;
  local_88[1] = fVar1;
  local_88[2] = fVar2;
  local_88[3] = fVar3;
  local_78[0] = fVar36;
  local_78[1] = fVar28;
  local_78[2] = fVar41;
  local_78[3] = fVar38;
  if (((params->super_RenderParams).flags & 1) == 0) {
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar44 = tcu::getEffectiveTextureView(&local_68,&local_d8,sampler);
    levels = TVar44.m_levels;
    fVar27 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      fVar27 = (params->super_RenderParams).bias;
    }
    local_178.m_data[0] = dst->m_width;
    local_178.m_data[1] = dst->m_height;
    local_f8.m_data[1] = 0;
    local_f8.m_data[0] = 0;
    if (TVar44.m_numLevels < 1) {
      local_f8.m_data[2] = 0;
    }
    else {
      local_f8.m_data[0] = (levels->m_size).m_data[0];
      local_f8.m_data[1] = (levels->m_size).m_data[1];
      local_f8.m_data[2] = (levels->m_size).m_data[2];
    }
    local_1e8.m_data[0] = fVar37;
    local_1e8.m_data[1] = fVar1;
    local_1e8.m_data[2] = fVar2;
    local_1dc.m_data[0] = fVar3;
    local_1dc.m_data[1] = fVar2;
    local_1dc.m_data[2] = fVar1;
    local_1c8.m_data[0] = fVar36;
    local_1c8.m_data[1] = fVar28;
    local_1c8.m_data[2] = fVar41;
    local_1bc.m_data[0] = fVar38;
    local_1bc.m_data[1] = fVar41;
    local_1bc.m_data[2] = fVar28;
    local_1a8.m_data[0] = fVar4;
    local_1a8.m_data[1] = fVar5;
    local_1a8.m_data[2] = fVar6;
    local_19c.m_data[0] = fVar7;
    local_19c.m_data[1] = fVar6;
    local_19c.m_data[2] = fVar5;
    fVar28 = computeNonProjectedTriLod
                       (params->lodMode,&local_178,&local_f8,&local_1c8,&local_1e8,&local_1a8);
    fVar28 = fVar28 + fVar27;
    fVar36 = params->maxLod;
    if (fVar28 <= params->maxLod) {
      fVar36 = fVar28;
    }
    uVar26 = -(uint)(fVar28 < params->minLod);
    local_188 = CONCAT44(local_188._4_4_,uVar26 & (uint)params->minLod | ~uVar26 & (uint)fVar36);
    fVar28 = computeNonProjectedTriLod
                       (params->lodMode,&local_178,&local_f8,&local_1bc,&local_1dc,&local_19c);
    fVar28 = fVar28 + fVar27;
    fVar36 = params->maxLod;
    if (fVar28 <= params->maxLod) {
      fVar36 = fVar28;
    }
    uVar26 = -(uint)(fVar28 < params->minLod);
    local_188 = CONCAT44(uVar26 & (uint)params->minLod | ~uVar26 & (uint)fVar36,
                         (undefined4)local_188);
    if (0 < dst->m_height) {
      iVar23 = 0;
      do {
        iVar24 = dst->m_width;
        if (0 < iVar24) {
          iVar25 = 0;
          do {
            fVar28 = ((float)iVar23 + 0.5) / (float)dst->m_height;
            fVar36 = ((float)iVar25 + 0.5) / (float)iVar24;
            bVar15 = 1.0 <= fVar36 + fVar28;
            if (bVar15) {
              fVar36 = 1.0 - fVar36;
              fVar28 = 1.0 - fVar28;
            }
            uVar16 = (ulong)bVar15;
            fVar41 = (&local_1c8)[uVar16].m_data[0];
            fVar38 = (&local_1e8)[uVar16].m_data[0];
            fVar37 = (&local_1a8)[uVar16].m_data[0];
            tcu::sampleLevelArray3D
                      ((tcu *)local_118,levels,TVar44.m_numLevels,sampler,
                       ((&local_1c8)[uVar16].m_data[1] - fVar41) * fVar28 +
                       ((&local_1bc)[uVar16 - 1].m_data[2] - fVar41) * fVar36 + fVar41,
                       ((&local_1e8)[uVar16].m_data[1] - fVar38) * fVar28 +
                       ((&local_1dc)[uVar16 - 1].m_data[2] - fVar38) * fVar36 + fVar38,
                       ((&local_1a8)[uVar16].m_data[1] - fVar37) * fVar28 +
                       ((&local_19c)[uVar16 - 1].m_data[2] - fVar37) * fVar36 + fVar37,
                       *(float *)((long)&local_188 + uVar16 * 4));
            local_168 = 0;
            uStack_160 = 0;
            lVar18 = 0;
            do {
              *(float *)((long)&local_168 + lVar18 * 4) =
                   local_118[lVar18] * (params->super_RenderParams).colorScale.m_data[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            local_208[0] = 0;
            local_208[1] = 0;
            uStack_200 = 0;
            lVar18 = 0;
            do {
              local_208[lVar18] =
                   (int)(*(float *)((long)&local_168 + lVar18 * 4) +
                        (params->super_RenderParams).colorBias.m_data[lVar18]);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            bVar14 = dst->m_colorMask;
            uVar17 = 0;
            uVar26 = 0;
            if ((bVar14 & 1) != 0) {
              uVar19 = 0x7e - (local_208[0] >> 0x17);
              uVar26 = ((local_208[0] & 0x7fffffU) * 0xff + 0x7f800000 >> ((byte)uVar19 & 0x1f)) +
                       0x800000;
              if (8 < uVar19) {
                uVar26 = uVar19;
              }
              uVar26 = uVar26 >> 0x18;
            }
            if ((bVar14 & 2) != 0) {
              uVar19 = 0x7e - (local_208[1] >> 0x17);
              uVar17 = ((local_208[1] & 0x7fffffU) * 0xff + 0x7f800000 >> ((byte)uVar19 & 0x1f)) +
                       0x800000;
              if (8 < uVar19) {
                uVar17 = uVar19;
              }
              uVar17 = uVar17 >> 0x10 & 0xff00;
            }
            uVar19 = 0;
            if ((bVar14 & 4) != 0) {
              uVar20 = 0x7e - ((int)(uint)uStack_200 >> 0x17);
              uVar19 = (((uint)uStack_200 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar20 & 0x1f))
                       + 0x800000;
              if (8 < uVar20) {
                uVar19 = uVar20;
              }
              uVar19 = uVar19 >> 8 & 0xff0000;
            }
            uVar20 = 0xff000000;
            if ((bVar14 & 8) != 0) {
              uVar21 = 0x7e - ((int)uStack_200._4_4_ >> 0x17);
              uVar20 = ((uStack_200._4_4_ & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar21 & 0x1f))
                       + 0x800000;
              if (8 < uVar21) {
                uVar20 = uVar21;
              }
              uVar20 = uVar20 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)((dst->m_y + iVar23) * dst->m_surface->m_width + dst->m_x + iVar25) * 4)
                 = uVar17 | uVar26 | uVar19 | uVar20;
            iVar25 = iVar25 + 1;
            iVar24 = dst->m_width;
          } while (iVar25 < iVar24);
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 < dst->m_height);
    }
  }
  else {
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar44 = tcu::getEffectiveTextureView(&local_68,&local_d8,sampler);
    local_1b0 = TVar44.m_levels;
    iVar23 = TVar44.m_numLevels;
    fVar27 = 0.0;
    local_210 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_210 = (params->super_RenderParams).bias;
    }
    iVar24 = dst->m_height;
    if (0 < iVar23) {
      fVar27 = (float)(local_1b0->m_size).m_data[0];
    }
    fVar33 = (float)dst->m_width;
    local_144 = (float)iVar24;
    local_178.m_data[0] = 0;
    local_178.m_data[1] = 0;
    uStack_170 = 0;
    lVar18 = 0;
    do {
      local_178.m_data[lVar18] = (int)(local_78[lVar18] * fVar27);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    if (iVar23 < 1) {
      fVar27 = 0.0;
    }
    else {
      fVar27 = (float)(local_1b0->m_size).m_data[1];
    }
    local_188 = 0;
    uStack_180 = 0;
    lVar18 = 0;
    do {
      *(float *)((long)&local_188 + lVar18 * 4) = local_88[lVar18] * fVar27;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    if (iVar23 < 1) {
      fVar27 = 0.0;
    }
    else {
      fVar27 = (float)(local_1b0->m_size).m_data[2];
    }
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_a8[2] = 0.0;
    local_a8[3] = 0.0;
    lVar18 = 0;
    do {
      local_a8[lVar18] = local_a8[lVar18 + 4] * fVar27;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    local_1c8.m_data[0] = fVar36;
    local_1c8.m_data[1] = fVar28;
    local_1c8.m_data[2] = fVar41;
    local_1bc.m_data[0] = fVar38;
    local_1bc.m_data[1] = fVar41;
    local_1bc.m_data[2] = fVar28;
    local_1e8.m_data[0] = fVar37;
    local_1e8.m_data[1] = fVar1;
    local_1e8.m_data[2] = fVar2;
    local_1dc.m_data[0] = fVar3;
    local_1dc.m_data[1] = fVar2;
    local_1dc.m_data[2] = fVar1;
    local_1a8.m_data[0] = fVar4;
    local_1a8.m_data[1] = fVar5;
    local_1a8.m_data[2] = fVar6;
    local_19c.m_data[0] = fVar7;
    local_19c.m_data[1] = fVar6;
    local_19c.m_data[2] = fVar5;
    local_1f4 = local_178.m_data[1];
    local_208[0] = local_178.m_data[0];
    local_208[1] = local_178.m_data[1];
    uStack_200 = uStack_170;
    local_1f8 = (undefined4)uStack_170;
    local_168 = local_188;
    uStack_160 = uStack_180;
    local_158 = (undefined4)uStack_180;
    local_154 = local_188._4_4_;
    local_118[0] = local_a8[0];
    local_118[1] = local_a8[1];
    local_118[2] = local_a8[2];
    local_118[3] = local_a8[3];
    local_118[4] = local_a8[2];
    local_118[5] = local_a8[1];
    local_f8.m_data[1] = (int)(params->super_RenderParams).w.m_data[1];
    local_f8.m_data[2] = (int)(params->super_RenderParams).w.m_data[2];
    local_f8.m_data[0] = (int)(params->super_RenderParams).w.m_data[0];
    local_ec = (params->super_RenderParams).w.m_data[3];
    local_e8 = (float)local_f8.m_data[2];
    local_e4 = (float)local_f8.m_data[1];
    if (0 < iVar24) {
      iVar24 = 0;
      local_134 = fVar33;
      do {
        iVar25 = dst->m_width;
        if (0 < iVar25) {
          local_138 = (float)iVar24 + 0.5;
          fVar36 = local_138 / local_144;
          local_13c = local_144 - local_138;
          local_140 = 1.0 - fVar36;
          iVar22 = 0;
          do {
            fVar37 = (float)iVar22 + 0.5;
            fVar38 = fVar37 / fVar33;
            bVar15 = 1.0 <= fVar36 + fVar38;
            fVar41 = local_138;
            fVar28 = fVar36;
            if (bVar15) {
              fVar37 = fVar33 - fVar37;
              fVar38 = 1.0 - fVar38;
              fVar41 = local_13c;
              fVar28 = local_140;
            }
            uVar16 = (ulong)bVar15;
            lVar18 = uVar16 * 0xc;
            fVar27 = (1.0 - fVar38) - fVar28;
            local_11c = (float)(&local_f8)[uVar16].m_data[0];
            fVar1 = (float)(&local_f8)[uVar16].m_data[1];
            fVar34 = ((&local_1c8)[uVar16].m_data[0] * fVar27) / local_11c;
            fVar2 = (&local_1c8)[uVar16].m_data[1];
            fVar3 = (&local_1bc)[uVar16 - 1].m_data[2];
            fVar4 = (float)(&local_f8)[uVar16].m_data[2];
            fVar35 = fVar38 / fVar4 + fVar28 / fVar1 + fVar27 / local_11c;
            fVar39 = ((&local_1e8)[uVar16].m_data[0] * fVar27) / local_11c;
            fVar5 = (&local_1e8)[uVar16].m_data[1];
            fVar6 = (&local_1dc)[uVar16 - 1].m_data[2];
            fVar7 = (&local_1a8)[uVar16].m_data[1];
            fVar31 = (fVar27 * (&local_1a8)[uVar16].m_data[0]) / local_11c;
            fVar27 = (&local_19c)[uVar16 - 1].m_data[2];
            local_120 = (float)iVar25;
            fVar32 = (float)dst->m_height;
            fVar42 = fVar41 / fVar32;
            fVar33 = *(float *)((long)&uStack_200 + lVar18);
            fVar8 = (float)local_208[uVar16 * 3];
            fVar9 = (float)local_208[uVar16 * 3 + 1];
            fVar10 = *(float *)((long)&local_168 + lVar18);
            fVar11 = *(float *)((long)&local_168 + lVar18 + 4);
            fVar12 = *(float *)((long)&uStack_160 + lVar18);
            local_12c = local_118[uVar16 * 3];
            fVar13 = local_118[uVar16 * 3 + 1];
            local_130 = local_118[uVar16 * 3 + 2];
            local_128 = ((fVar13 - local_12c) * fVar4 + (local_130 - fVar13) * local_11c) * fVar42;
            fVar43 = fVar42 + -1.0;
            local_124 = fVar37 / local_120;
            fVar29 = local_124 + -1.0;
            fVar40 = (local_120 * fVar43 + fVar37) * fVar1 * fVar4 -
                     (fVar4 * local_120 * fVar42 + fVar1 * fVar37) * local_11c;
            fVar30 = local_11c * fVar1 * fVar4;
            fVar37 = fVar30 * local_120;
            fVar40 = fVar40 * fVar40;
            fVar41 = (fVar32 * fVar29 + fVar41) * fVar1 * fVar4 -
                     (fVar1 * fVar32 * local_124 + fVar41 * fVar4) * local_11c;
            fVar30 = fVar30 * fVar32;
            fVar41 = fVar41 * fVar41;
            fVar41 = computeLodFromDerivates
                               (params->lodMode,
                                (((fVar8 - fVar33) * fVar1 * fVar43 +
                                 ((fVar9 - fVar8) * fVar4 + (fVar33 - fVar9) * local_11c) * fVar42)
                                * fVar37) / fVar40,
                                (((fVar10 - fVar12) * fVar1 * fVar43 +
                                 ((fVar11 - fVar10) * fVar4 + (fVar12 - fVar11) * local_11c) *
                                 fVar42) * fVar37) / fVar40,
                                (((local_12c - local_130) * fVar1 * fVar43 + local_128) * fVar37) /
                                fVar40,(((fVar8 - fVar9) * fVar4 * fVar29 +
                                        ((fVar9 - fVar33) * local_11c + (fVar33 - fVar8) * fVar1) *
                                        local_124) * fVar30) / fVar41,
                                (((fVar10 - fVar11) * fVar4 * fVar29 +
                                 ((fVar11 - fVar12) * local_11c + (fVar12 - fVar10) * fVar1) *
                                 local_124) * fVar30) / fVar41,
                                (((local_12c - fVar13) * fVar4 * fVar29 +
                                 ((fVar13 - local_130) * local_11c + (local_130 - local_12c) * fVar1
                                 ) * local_124) * fVar30) / fVar41);
            tcu::sampleLevelArray3D
                      (local_40,local_1b0,iVar23,sampler,
                       ((fVar3 * fVar38) / fVar4 + (fVar2 * fVar28) / fVar1 + fVar34) / fVar35,
                       ((fVar6 * fVar38) / fVar4 + (fVar5 * fVar28) / fVar1 + fVar39) / fVar35,
                       ((fVar38 * fVar27) / fVar4 + (fVar28 * fVar7) / fVar1 + fVar31) / fVar35,
                       fVar41 + local_210);
            local_58[0] = 0.0;
            local_58[1] = 0.0;
            local_58[2] = 0.0;
            local_58[3] = 0.0;
            lVar18 = 0;
            do {
              local_58[lVar18] =
                   *(float *)(local_40 + lVar18 * 4) *
                   (params->super_RenderParams).colorScale.m_data[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            _local_b8 = 0;
            uStack_b0 = 0;
            lVar18 = 0;
            do {
              (&local_b8)[lVar18] =
                   local_58[lVar18] + (params->super_RenderParams).colorBias.m_data[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            bVar14 = dst->m_colorMask;
            uVar17 = 0;
            uVar26 = 0;
            if ((bVar14 & 1) != 0) {
              uVar19 = 0x7e - ((int)local_b8 >> 0x17);
              uVar26 = (((uint)local_b8 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar19 & 0x1f)) +
                       0x800000;
              if (8 < uVar19) {
                uVar26 = uVar19;
              }
              uVar26 = uVar26 >> 0x18;
            }
            if ((bVar14 & 2) != 0) {
              uVar19 = 0x7e - ((int)uStack_b4 >> 0x17);
              uVar17 = ((uStack_b4 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar19 & 0x1f)) +
                       0x800000;
              if (8 < uVar19) {
                uVar17 = uVar19;
              }
              uVar17 = uVar17 >> 0x10 & 0xff00;
            }
            uVar19 = 0;
            if ((bVar14 & 4) != 0) {
              uVar20 = 0x7e - ((int)(uint)uStack_b0 >> 0x17);
              uVar19 = (((uint)uStack_b0 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar20 & 0x1f)) +
                       0x800000;
              if (8 < uVar20) {
                uVar19 = uVar20;
              }
              uVar19 = uVar19 >> 8 & 0xff0000;
            }
            uVar20 = 0xff000000;
            if ((bVar14 & 8) != 0) {
              uVar21 = 0x7e - ((int)uStack_b0._4_4_ >> 0x17);
              uVar20 = ((uStack_b0._4_4_ & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar21 & 0x1f)) +
                       0x800000;
              if (8 < uVar21) {
                uVar20 = uVar21;
              }
              uVar20 = uVar20 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)((dst->m_y + iVar24) * dst->m_surface->m_width + dst->m_x + iVar22) * 4)
                 = uVar17 | uVar26 | uVar19 | uVar20;
            iVar22 = iVar22 + 1;
            iVar25 = dst->m_width;
            fVar33 = local_134;
          } while (iVar22 < iVar25);
        }
        iVar24 = iVar24 + 1;
      } while (iVar24 < dst->m_height);
    }
  }
  if (local_d8.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture3DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture3DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4				rq		= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, tq, rq, params);
	else
		sampleTextureNonProjected(dst, view, sq, tq, rq, params);
}